

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQueryReliablePdu.cpp
# Opt level: O2

void __thiscall
DIS::RecordQueryReliablePdu::unmarshal(RecordQueryReliablePdu *this,DataStream *dataStream)

{
  ulong uVar1;
  FourByteChunk x;
  FourByteChunk FStack_38;
  
  SimulationManagementWithReliabilityFamilyPdu::unmarshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  DataStream::operator>>(dataStream,&this->_requestID);
  DataStream::operator>>(dataStream,&this->_requiredReliabilityService);
  DataStream::operator>>(dataStream,&this->_pad1);
  DataStream::operator>>(dataStream,&this->_pad2);
  DataStream::operator>>(dataStream,&this->_eventType);
  DataStream::operator>>(dataStream,&this->_time);
  DataStream::operator>>(dataStream,&this->_numberOfRecords);
  std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::clear(&this->_recordIDs);
  for (uVar1 = 0; uVar1 < this->_numberOfRecords; uVar1 = uVar1 + 1) {
    FourByteChunk::FourByteChunk(&FStack_38);
    FourByteChunk::unmarshal(&FStack_38,dataStream);
    std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::push_back
              (&this->_recordIDs,&FStack_38);
    FourByteChunk::~FourByteChunk(&FStack_38);
  }
  return;
}

Assistant:

void RecordQueryReliablePdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementWithReliabilityFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _requestID;
    dataStream >> _requiredReliabilityService;
    dataStream >> _pad1;
    dataStream >> _pad2;
    dataStream >> _eventType;
    dataStream >> _time;
    dataStream >> _numberOfRecords;

     _recordIDs.clear();
     for(size_t idx = 0; idx < _numberOfRecords; idx++)
     {
        FourByteChunk x;
        x.unmarshal(dataStream);
        _recordIDs.push_back(x);
     }
}